

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_ctrl.c
# Opt level: O0

int dh_paramgen_check(EVP_PKEY_CTX *ctx)

{
  int *in_RDI;
  char *unaff_retaddr;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RDI == (int *)0x0) || ((*in_RDI != 2 && (*in_RDI != 4)))) {
    ERR_new();
    ERR_set_debug(unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_RDI);
    ERR_set_error(6,0x93,(char *)0x0);
    iVar1 = -2;
  }
  else if ((*(long *)(in_RDI + 8) == 0) &&
          ((**(int **)(in_RDI + 0x1e) != 0x1c && (**(int **)(in_RDI + 0x1e) != 0x398)))) {
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int dh_paramgen_check(EVP_PKEY_CTX *ctx)
{
    if (ctx == NULL || !EVP_PKEY_CTX_IS_GEN_OP(ctx)) {
        ERR_raise(ERR_LIB_EVP, EVP_R_COMMAND_NOT_SUPPORTED);
        /* Uses the same return values as EVP_PKEY_CTX_ctrl */
        return -2;
    }
    /* If key type not DH return error */
    if (evp_pkey_ctx_is_legacy(ctx)
        && ctx->pmeth->pkey_id != EVP_PKEY_DH
        && ctx->pmeth->pkey_id != EVP_PKEY_DHX)
        return -1;
    return 1;
}